

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

long __thiscall FString::IndexOf(FString *this,char subchar,long startIndex)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  
  pcVar1 = this->Chars;
  if ((startIndex < 1) || ((ulong)startIndex < (ulong)*(uint *)(pcVar1 + -0xc))) {
    pcVar2 = strchr(pcVar1 + startIndex,(int)subchar);
    uVar3 = -(ulong)(pcVar2 == (char *)0x0) | (long)pcVar2 - (long)pcVar1;
  }
  else {
    uVar3 = 0xffffffffffffffff;
  }
  return uVar3;
}

Assistant:

long FString::IndexOf (char subchar, long startIndex) const
{
	if (startIndex > 0 && Len() <= (size_t)startIndex)
	{
		return -1;
	}
	char *str = strchr (Chars + startIndex, subchar);
	if (str == NULL)
	{
		return -1;
	}
	return long(str - Chars);
}